

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::HandleFlowSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  allocator local_51;
  Mark local_50;
  string local_40;
  
  Scanner::pop(this->m_scanner);
  CollectionStack::PushCollectionType
            ((this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl,FlowSeq);
  while( true ) {
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      local_50 = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string((string *)&local_40,"end of sequence flow not found",&local_51);
      ParserException::ParserException(pPVar3,&local_50,&local_40);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    if (pTVar2->type == FLOW_SEQ_END) break;
    HandleNode(this,eventHandler);
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      local_50 = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string((string *)&local_40,"end of sequence flow not found",&local_51);
      ParserException::ParserException(pPVar3,&local_50,&local_40);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    if (pTVar2->type != FLOW_SEQ_END) {
      if (pTVar2->type != FLOW_ENTRY) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
        std::__cxx11::string::string
                  ((string *)&local_40,"end of sequence flow not found",(allocator *)&local_50);
        ParserException::ParserException(pPVar3,&pTVar2->mark,&local_40);
        __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
      }
      Scanner::pop(this->m_scanner);
    }
  }
  Scanner::pop(this->m_scanner);
  std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::pop_back
            ((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
             (this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
  return;
}

Assistant:

void SingleDocParser::HandleFlowSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // first check for end
    if (m_scanner.peek().type == Token::FLOW_SEQ_END) {
      m_scanner.pop();
      break;
    }

    // then read the node
    HandleNode(eventHandler);

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ_FLOW);

    // now eat the separator (or could be a sequence end, which we ignore - but
    // if it's neither, then it's a bad node)
    Token& token = m_scanner.peek();
    if (token.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (token.type != Token::FLOW_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowSeq);
}